

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

int Gia_ManSimSimulateEquiv(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  long lVar1;
  long lVar2;
  Gia_Man_t *p_00;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  Gia_Obj_t *p_01;
  int iVar7;
  int iVar8;
  uint uVar9;
  abctime aVar10;
  uint *pInfo;
  Abc_Cex_t *pAVar11;
  bool bVar12;
  long local_50;
  abctime nTimeToStop;
  int iPat;
  int iOut;
  int RetValue;
  int i;
  abctime clkTotal;
  Gia_Obj_t *pObj;
  Gia_Sim2_t *p;
  Gia_ParSim_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  p = (Gia_Sim2_t *)pPars;
  pPars_local = (Gia_ParSim_t *)pAig;
  _RetValue = Abc_Clock();
  iPat = 0;
  if (*(int *)((long)&p->pPars + 4) == 0) {
    local_50 = 0;
  }
  else {
    iVar8 = *(int *)((long)&p->pPars + 4);
    aVar10 = Abc_Clock();
    local_50 = (long)iVar8 * 1000000 + aVar10;
  }
  if ((*(long *)&pPars_local[6].iOutFail == 0) ||
     (lVar1._0_4_ = pPars_local[7].nIters, lVar1._4_4_ = pPars_local[7].RandSeed, lVar1 == 0)) {
    __assert_fail("pAig->pReprs && pAig->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim2.c"
                  ,0x285,"int Gia_ManSimSimulateEquiv(Gia_Man_t *, Gia_ParSim_t *)");
  }
  lVar2._0_4_ = pPars_local[0xd].TimeLimit;
  lVar2._4_4_ = pPars_local[0xd].fCheckMiter;
  if (lVar2 != 0) {
    free(*(void **)&pPars_local[0xd].TimeLimit);
    pPars_local[0xd].TimeLimit = 0;
    pPars_local[0xd].fCheckMiter = 0;
  }
  pObj = (Gia_Obj_t *)Gia_Sim2Create((Gia_Man_t *)pPars_local,(Gia_ParSim_t *)p);
  Gia_ManResetRandom((Gia_ParSim_t *)p);
  iOut = 0;
  while( true ) {
    iVar8 = iOut;
    iVar7 = Gia_ManRegNum(*(Gia_Man_t **)pObj);
    bVar12 = false;
    if (iVar8 < iVar7) {
      p_00 = *(Gia_Man_t **)pObj;
      iVar8 = Gia_ManPiNum(*(Gia_Man_t **)pObj);
      clkTotal = (abctime)Gia_ManCi(p_00,iVar8 + iOut);
      bVar12 = (Gia_Obj_t *)clkTotal != (Gia_Obj_t *)0x0;
    }
    p_01 = pObj;
    if (!bVar12) break;
    iVar8 = Gia_ObjValue((Gia_Obj_t *)clkTotal);
    pInfo = Gia_Sim2Data((Gia_Sim2_t *)p_01,iVar8);
    Gia_Sim2InfoZero((Gia_Sim2_t *)p_01,pInfo);
    iOut = iOut + 1;
  }
  iOut = 0;
  do {
    if (*(int *)((long)&p->pAig + 4) <= iOut) {
LAB_00236b39:
      Gia_Sim2Delete((Gia_Sim2_t *)pObj);
      lVar6._0_4_ = pPars_local[0xd].TimeLimit;
      lVar6._4_4_ = pPars_local[0xd].fCheckMiter;
      if (lVar6 == 0) {
        Abc_Print(1,"No bug detected after simulating %d frames with %d words.  ",(ulong)(uint)iOut,
                  (ulong)*(uint *)&p->pAig);
      }
      aVar10 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar10 - _RetValue);
      return iPat;
    }
    Gia_Sim2SimulateRound((Gia_Sim2_t *)pObj);
    if (*(int *)&p->field_0x14 != 0) {
      Abc_Print(1,"Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iOut + 1),
                (ulong)*(uint *)((long)&p->pAig + 4),(ulong)*(uint *)((long)&p->pPars + 4));
      if ((*(long *)&pPars_local[6].iOutFail != 0) &&
         (lVar3._0_4_ = pPars_local[7].nIters, lVar3._4_4_ = pPars_local[7].RandSeed, lVar3 != 0)) {
        uVar9 = Gia_ManEquivCountLitsAll((Gia_Man_t *)pPars_local);
        Abc_Print(1,"Lits = %4d. ",(ulong)uVar9);
      }
      aVar10 = Abc_Clock();
      Abc_Print(1,"Time = %7.2f sec\r",((double)aVar10 + -(double)_RetValue) / 1000000.0);
    }
    if ((p->nWords != 0) &&
       (iVar8 = Gia_Sim2CheckPos((Gia_Sim2_t *)pObj,(int *)((long)&nTimeToStop + 4),
                                 (int *)&nTimeToStop), iVar8 != 0)) {
      Gia_ManResetRandom((Gia_ParSim_t *)p);
      *(uint *)&p->pDataSim = nTimeToStop._4_4_;
      pAVar11 = Gia_Sim2GenerateCounter
                          ((Gia_Man_t *)pPars_local,iOut,nTimeToStop._4_4_,
                           *(int *)&pObj[1].field_0x4,(int)nTimeToStop);
      *(Abc_Cex_t **)&pPars_local[0xd].TimeLimit = pAVar11;
      uVar4._0_4_ = pPars_local->nWords;
      uVar4._4_4_ = pPars_local->nIters;
      Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",(ulong)nTimeToStop._4_4_,
                uVar4,(ulong)(uint)iOut);
      iVar8 = Gia_ManVerifyCex((Gia_Man_t *)pPars_local,*(Abc_Cex_t **)&pPars_local[0xd].TimeLimit,0
                              );
      if (iVar8 == 0) {
        Abc_Print(1,"\nGenerated counter-example is INVALID.                    ");
      }
      iPat = 1;
      goto LAB_00236b39;
    }
    if ((*(long *)&pPars_local[6].iOutFail != 0) &&
       (lVar5._0_4_ = pPars_local[7].nIters, lVar5._4_4_ = pPars_local[7].RandSeed, lVar5 != 0)) {
      Gia_Sim2InfoRefineEquivs((Gia_Sim2_t *)pObj);
    }
    aVar10 = Abc_Clock();
    if (local_50 < aVar10) {
      iOut = iOut + 1;
      goto LAB_00236b39;
    }
    if (iOut < *(int *)((long)&p->pAig + 4) + -1) {
      Gia_Sim2InfoTransfer((Gia_Sim2_t *)pObj);
    }
    iOut = iOut + 1;
  } while( true );
}

Assistant:

int Gia_ManSimSimulateEquiv( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    Gia_Sim2_t * p;
    Gia_Obj_t * pObj;
    abctime clkTotal = Abc_Clock();
    int i, RetValue = 0, iOut, iPat;
    abctime nTimeToStop = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;
    assert( pAig->pReprs && pAig->pNexts );
    ABC_FREE( pAig->pCexSeq );
    p = Gia_Sim2Create( pAig, pPars );
    Gia_ManResetRandom( pPars );
    Gia_ManForEachRo( p->pAig, pObj, i )
        Gia_Sim2InfoZero( p, Gia_Sim2Data(p, Gia_ObjValue(pObj)) );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_Sim2SimulateRound( p );
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d out of %4d and timeout %3d sec. ", i+1, pPars->nIters, pPars->TimeLimit );
            if ( pAig->pReprs && pAig->pNexts )
                Abc_Print( 1, "Lits = %4d. ", Gia_ManEquivCountLitsAll(pAig) );
            Abc_Print( 1, "Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC );
        }
        if ( pPars->fCheckMiter && Gia_Sim2CheckPos( p, &iOut, &iPat ) )
        {
            Gia_ManResetRandom( pPars );
            pPars->iOutFail = iOut;
            pAig->pCexSeq = Gia_Sim2GenerateCounter( pAig, i, iOut, p->nWords, iPat );
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", iOut, pAig->pName, i );
            if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            {
//                Abc_Print( 1, "\n" );
                Abc_Print( 1, "\nGenerated counter-example is INVALID.                    " );
//                Abc_Print( 1, "\n" );
            }
            else
            {
//                Abc_Print( 1, "\n" );
//                if ( pPars->fVerbose )
//                Abc_Print( 1, "\nGenerated counter-example is verified correctly.         " );
//                Abc_Print( 1, "\n" );
            }
            RetValue = 1;
            break;
        }
        if ( pAig->pReprs && pAig->pNexts )
            Gia_Sim2InfoRefineEquivs( p );
        if ( Abc_Clock() > nTimeToStop )
        {
            i++;
            break;
        }
        if ( i < pPars->nIters - 1 )
            Gia_Sim2InfoTransfer( p );
    }
    Gia_Sim2Delete( p );
    if ( pAig->pCexSeq == NULL )
        Abc_Print( 1, "No bug detected after simulating %d frames with %d words.  ", i, pPars->nWords );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    return RetValue;
}